

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_retcode
resobj_Alloc(CUPDLPresobj *resobj,CUPDLPproblem *problem,cupdlp_int ncols,cupdlp_int nrows)

{
  cupdlp_float *pcVar1;
  cupdlp_float *pcVar2;
  cupdlp_retcode cVar3;
  size_t __nmemb;
  size_t __nmemb_00;
  
  __nmemb_00 = (size_t)nrows;
  pcVar1 = (cupdlp_float *)calloc(__nmemb_00,8);
  resobj->primalResidual = pcVar1;
  cVar3 = 1;
  if (pcVar1 != (cupdlp_float *)0x0) {
    __nmemb = (size_t)ncols;
    pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
    resobj->dualResidual = pcVar1;
    if (pcVar1 != (cupdlp_float *)0x0) {
      pcVar1 = (cupdlp_float *)calloc(__nmemb_00,8);
      resobj->primalResidualAverage = pcVar1;
      if (pcVar1 != (cupdlp_float *)0x0) {
        pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
        resobj->dualResidualAverage = pcVar1;
        if (pcVar1 != (cupdlp_float *)0x0) {
          pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
          resobj->dSlackPos = pcVar1;
          if (pcVar1 != (cupdlp_float *)0x0) {
            pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
            resobj->dSlackNeg = pcVar1;
            if (pcVar1 != (cupdlp_float *)0x0) {
              pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
              resobj->dSlackPosAverage = pcVar1;
              if (pcVar1 != (cupdlp_float *)0x0) {
                pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
                resobj->dSlackNegAverage = pcVar1;
                if (pcVar1 != (cupdlp_float *)0x0) {
                  pcVar1 = (cupdlp_float *)calloc(__nmemb,8);
                  resobj->dLowerFiltered = pcVar1;
                  if (pcVar1 != (cupdlp_float *)0x0) {
                    pcVar2 = (cupdlp_float *)calloc(__nmemb,8);
                    resobj->dUpperFiltered = pcVar2;
                    if (pcVar2 != (cupdlp_float *)0x0) {
                      pcVar2 = (cupdlp_float *)calloc(__nmemb,8);
                      resobj->primalInfeasRay = pcVar2;
                      if (pcVar2 != (cupdlp_float *)0x0) {
                        pcVar2 = (cupdlp_float *)calloc(__nmemb_00,8);
                        resobj->primalInfeasConstr = pcVar2;
                        if (pcVar2 != (cupdlp_float *)0x0) {
                          pcVar2 = (cupdlp_float *)calloc(__nmemb,8);
                          resobj->primalInfeasBound = pcVar2;
                          if (pcVar2 != (cupdlp_float *)0x0) {
                            pcVar2 = (cupdlp_float *)calloc(__nmemb_00,8);
                            resobj->dualInfeasRay = pcVar2;
                            if (pcVar2 != (cupdlp_float *)0x0) {
                              pcVar2 = (cupdlp_float *)calloc(__nmemb,8);
                              resobj->dualInfeasLbRay = pcVar2;
                              if (pcVar2 != (cupdlp_float *)0x0) {
                                pcVar2 = (cupdlp_float *)calloc(__nmemb,8);
                                resobj->dualInfeasUbRay = pcVar2;
                                if (pcVar2 != (cupdlp_float *)0x0) {
                                  pcVar2 = (cupdlp_float *)calloc(__nmemb,8);
                                  resobj->dualInfeasConstr = pcVar2;
                                  if (pcVar2 != (cupdlp_float *)0x0) {
                                    cupdlp_filterlb(pcVar1,problem->lower,-INFINITY,ncols);
                                    cupdlp_filterub(resobj->dUpperFiltered,problem->upper,INFINITY,
                                                    ncols);
                                    resobj->dFeasTol = 1e-08;
                                    resobj->dPrimalObj = 0.0;
                                    resobj->dDualObj = 0.0;
                                    resobj->dRelObjGap = 0.0;
                                    resobj->dDualityGap = 0.0;
                                    resobj->dComplementarity = 0.0;
                                    resobj->dPrimalFeas = 0.0;
                                    resobj->dDualFeas = 0.0;
                                    resobj->dPrimalObjAverage = 0.0;
                                    resobj->dDualObjAverage = 0.0;
                                    resobj->dDualityGapAverage = 0.0;
                                    resobj->dComplementarityAverage = 0.0;
                                    resobj->dPrimalFeasAverage = 0.0;
                                    resobj->dDualFeasAverage = 0.0;
                                    resobj->dRelObjGapAverage = 0.0;
                                    resobj->dPrimalFeasLastRestart = 0.0;
                                    resobj->dDualFeasLastRestart = 0.0;
                                    resobj->dDualityGapLastRestart = 0.0;
                                    resobj->dPrimalFeasLastCandidate = 0.0;
                                    resobj->dDualFeasLastCandidate = 0.0;
                                    resobj->dDualityGapLastCandidate = 0.0;
                                    resobj->primalCode = FEASIBLE;
                                    resobj->dualCode = FEASIBLE;
                                    resobj->termInfeasIterate = LAST_ITERATE;
                                    resobj->dPrimalInfeasObj = 0.0;
                                    resobj->dDualInfeasObj = 0.0;
                                    resobj->dPrimalInfeasRes = 1.0;
                                    resobj->dDualInfeasRes = 1.0;
                                    resobj->dPrimalInfeasObjAverage = 0.0;
                                    resobj->dDualInfeasObjAverage = 0.0;
                                    resobj->dPrimalInfeasResAverage = 1.0;
                                    resobj->dDualInfeasResAverage = 1.0;
                                    resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
                                    resobj->termIterate = LAST_ITERATE;
                                    cVar3 = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar3;
}

Assistant:

cupdlp_retcode resobj_Alloc(CUPDLPresobj *resobj, CUPDLPproblem *problem,
                            cupdlp_int ncols, cupdlp_int nrows) {
  cupdlp_retcode retcode = RETCODE_OK;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  resobj->primalResidual = NULL;
  resobj->dualResidual = NULL;
  resobj->primalResidualAverage = NULL;
  resobj->dualResidualAverage = NULL;
#else

  cupdlp_init_zero_vec_double(resobj->primalResidual, nrows);
  cupdlp_init_zero_vec_double(resobj->dualResidual, ncols);
  cupdlp_init_zero_vec_double(resobj->primalResidualAverage, nrows);
  cupdlp_init_zero_vec_double(resobj->dualResidualAverage, ncols);

#endif

  cupdlp_init_zero_vec_double(resobj->dSlackPos, ncols);
  cupdlp_init_zero_vec_double(resobj->dSlackNeg, ncols);
  cupdlp_init_zero_vec_double(resobj->dSlackPosAverage, ncols);
  cupdlp_init_zero_vec_double(resobj->dSlackNegAverage, ncols);
  cupdlp_init_zero_vec_double(resobj->dLowerFiltered, ncols);
  cupdlp_init_zero_vec_double(resobj->dUpperFiltered, ncols);

#if !defined(CUPDLP_CPU) && USE_KERNELS
  resobj->primalInfeasRay = NULL;
  resobj->primalInfeasConstr = NULL;
  resobj->primalInfeasBound = NULL;
  resobj->dualInfeasRay = NULL;
  resobj->dualInfeasLbRay = NULL;
  resobj->dualInfeasUbRay = NULL;
#else

  cupdlp_init_zero_vec_double(resobj->primalInfeasRay, ncols);
  cupdlp_init_zero_vec_double(resobj->primalInfeasConstr, nrows);
  cupdlp_init_zero_vec_double(resobj->primalInfeasBound, ncols);
  cupdlp_init_zero_vec_double(resobj->dualInfeasRay, nrows);
  cupdlp_init_zero_vec_double(resobj->dualInfeasLbRay, ncols);
  cupdlp_init_zero_vec_double(resobj->dualInfeasUbRay, ncols);
#endif


#if !defined(CUPDLP_CPU) && USE_KERNELS
  resobj->dualInfeasConstr = NULL;
#else
  cupdlp_init_zero_vec_double(resobj->dualInfeasConstr, ncols);
#endif

  // CUPDLP_INIT_DOUBLE_ZERO_VEC(resobj->dualInfeasBound, nrows);

  cupdlp_filterlb(resobj->dLowerFiltered, problem->lower, -INFINITY, ncols);
  cupdlp_filterub(resobj->dUpperFiltered, problem->upper, +INFINITY, ncols);

  // initialization
  resobj->dFeasTol = 1e-8;
  resobj->dPrimalObj = 0.0;
  resobj->dDualObj = 0.0;
  resobj->dDualityGap = 0.0;
  resobj->dComplementarity = 0.0;
  resobj->dPrimalFeas = 0.0;
  resobj->dDualFeas = 0.0;
  resobj->dRelObjGap = 0.0;
  resobj->dPrimalObjAverage = 0.0;
  resobj->dDualObjAverage = 0.0;
  resobj->dDualityGapAverage = 0.0;
  resobj->dComplementarityAverage = 0.0;
  resobj->dPrimalFeasAverage = 0.0;
  resobj->dDualFeasAverage = 0.0;
  resobj->dRelObjGapAverage = 0.0;
  resobj->dPrimalFeasLastRestart = 0.0;
  resobj->dDualFeasLastRestart = 0.0;
  resobj->dDualityGapLastRestart = 0.0;
  resobj->dPrimalFeasLastCandidate = 0.0;
  resobj->dDualFeasLastCandidate = 0.0;
  resobj->dDualityGapLastCandidate = 0.0;

  resobj->primalCode = FEASIBLE;
  resobj->dualCode = FEASIBLE;
  resobj->termInfeasIterate = LAST_ITERATE;
  resobj->dPrimalInfeasObj = 0.0;
  resobj->dDualInfeasObj = 0.0;
  resobj->dPrimalInfeasRes = 1.0;
  resobj->dDualInfeasRes = 1.0;
  resobj->dPrimalInfeasObjAverage = 0.0;
  resobj->dDualInfeasObjAverage = 0.0;
  resobj->dPrimalInfeasResAverage = 1.0;
  resobj->dDualInfeasResAverage = 1.0;

  resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
  resobj->termIterate = LAST_ITERATE;

  // todo, pass work
  //   cupdlp_twoNorm(problem->cost, ncols, &resobj->dNormCost);
  //   twoNorm(problem->rhs, nrows);

exit_cleanup:
  return retcode;
}